

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O2

string * IOcontroller::get_out_file_name_budget
                   (string *__return_storage_ptr__,string *graphName,string *algName,
                   double budpercent,double normalpha,double percent,double eps,double feps,
                   string *probDist,float probEdge)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  bVar1 = std::operator==(probDist,"UNI");
  if (bVar1) {
    std::operator+(&local_a8,graphName,"_");
    std::operator+(&local_88,&local_a8,algName);
    std::operator+(&local_228,&local_88,"_");
    std::__cxx11::to_string(&local_248,budpercent);
    std::operator+(&local_208,&local_228,&local_248);
    std::operator+(&local_1e8,&local_208,"_");
    std::__cxx11::to_string(&local_268,normalpha);
    std::operator+(&local_1c8,&local_1e8,&local_268);
    std::operator+(&local_1a8,&local_1c8,"_");
    std::__cxx11::to_string(&local_288,percent);
    std::operator+(&local_188,&local_1a8,&local_288);
    std::operator+(&local_168,&local_188,"_");
    std::__cxx11::to_string(&local_2a8,eps);
    std::operator+(&local_148,&local_168,&local_2a8);
    std::operator+(&local_128,&local_148,"_");
    std::__cxx11::to_string(&local_48,feps);
    std::operator+(&local_108,&local_128,&local_48);
    std::operator+(&local_e8,&local_108,"_");
    std::operator+(&local_c8,&local_e8,probDist);
    std::__cxx11::to_string(&local_68,probEdge);
    std::operator+(__return_storage_ptr__,&local_c8,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_88);
    this = &local_a8;
  }
  else {
    std::operator+(&local_88,graphName,"_");
    std::operator+(&local_228,&local_88,algName);
    std::operator+(&local_208,&local_228,"_");
    std::__cxx11::to_string(&local_a8,budpercent);
    std::operator+(&local_1e8,&local_208,&local_a8);
    std::operator+(&local_1c8,&local_1e8,"_");
    std::__cxx11::to_string(&local_248,normalpha);
    std::operator+(&local_1a8,&local_1c8,&local_248);
    std::operator+(&local_188,&local_1a8,"_");
    std::__cxx11::to_string(&local_268,percent);
    std::operator+(&local_168,&local_188,&local_268);
    std::operator+(&local_148,&local_168,"_");
    std::__cxx11::to_string(&local_288,eps);
    std::operator+(&local_128,&local_148,&local_288);
    std::operator+(&local_108,&local_128,"_");
    std::__cxx11::to_string(&local_2a8,feps);
    std::operator+(&local_e8,&local_108,&local_2a8);
    std::operator+(&local_c8,&local_e8,"_");
    std::operator+(__return_storage_ptr__,&local_c8,probDist);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    this = &local_88;
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

static std::string get_out_file_name_budget(const std::string graphName, const std::string algName,
            const double budpercent, const double normalpha, const double percent, const double eps,
            const double feps, const std::string probDist, const float probEdge) {
        if (probDist == "UNI") {
            return graphName + "_" + algName + "_" + std::to_string(budpercent) +
                   "_" + std::to_string(normalpha) + "_" + std::to_string(percent) +
                   "_" + std::to_string(eps) + "_" + std::to_string(feps) +
                   "_" + probDist + std::to_string(probEdge);
        }
        return graphName + "_" + algName + "_" + std::to_string(budpercent) +
               "_" + std::to_string(normalpha) + "_" + std::to_string(percent) +
               "_" + std::to_string(eps) + "_" + std::to_string(feps) + "_" + probDist;
    }